

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O3

void __thiscall CgroupController::CgroupController(CgroupController *this,string *name,string *id)

{
  pointer pcVar1;
  Config *this_00;
  path *__lhs;
  ContextManager *pCVar2;
  error_code error;
  path local_110;
  undefined1 local_e8 [40];
  path local_c0;
  path local_98;
  path local_70;
  path local_48;
  
  std::filesystem::__cxx11::path::path(&this->path_);
  this->enter_fd_ = -1;
  this_00 = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,name,auto_format);
  std::filesystem::__cxx11::operator/((path *)(local_e8 + 0x28),__lhs,&local_48);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_70,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/(&local_110,(path *)(local_e8 + 0x28),&local_70);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_98,id,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_e8,&local_110,&local_98);
  if ((CgroupController *)local_e8 != this) {
    CgroupController(this);
  }
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path((path *)(local_e8 + 0x28));
  std::filesystem::__cxx11::path::~path(&local_48);
  local_c0._M_pathname._M_dataplus._M_p._0_4_ = 0;
  local_c0._M_pathname._M_string_length = std::_V2::system_category();
  std::filesystem::create_directories(&this->path_,(error_code *)(local_e8 + 0x28));
  if ((int)local_c0._M_pathname._M_dataplus._M_p != 0) {
    pCVar2 = ContextManager::get();
    pcVar1 = (this->path_)._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)local_c0._M_pathname._M_string_length + 0x20))
              (&local_110,local_c0._M_pathname._M_string_length,
               (int)local_c0._M_pathname._M_dataplus._M_p);
    format_abi_cxx11_((string *)local_e8,"Cannot create dir \'%s\': %s",pcVar1,
                      local_110._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_pathname._M_dataplus._M_p != &local_110._M_pathname.field_2) {
      operator_delete(local_110._M_pathname._M_dataplus._M_p,
                      local_110._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

CgroupController::CgroupController(const std::string &name, const std::string &id) {
    path_ = Config::get().get_cgroup_root() / name / "libsbox" / id;
    std::error_code error;
    fs::create_directories(path_, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path_.c_str(), error.message().c_str()));
    }
}